

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_label.c
# Opt level: O2

void HTS_Label_load_from_strings
               (HTS_Label *label,size_t sampling_rate,size_t fperiod,char **lines,size_t num_lines)

{
  HTS_Boolean HVar1;
  ushort **ppuVar2;
  HTS_LabelString *pHVar3;
  char *pcVar4;
  size_t sVar5;
  HTS_LabelString *pHVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  size_t data_index;
  double local_468;
  double dStack_460;
  double local_458;
  double local_448;
  char buff [1024];
  
  if ((label->head != (HTS_LabelString *)0x0) || (label->size != 0)) {
    HTS_error(1,"HTS_Label_load_from_fp: label list is not initialized.\n");
    return;
  }
  auVar7._8_4_ = (int)(sampling_rate >> 0x20);
  auVar7._0_8_ = sampling_rate;
  auVar7._12_4_ = 0x45300000;
  auVar8._8_4_ = (int)(fperiod >> 0x20);
  auVar8._0_8_ = fperiod;
  auVar8._12_4_ = 0x45300000;
  local_468 = ((auVar7._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)sampling_rate) - 4503599627370496.0)) /
              (((auVar8._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)fperiod) - 4503599627370496.0)) * 10000000.0);
  pHVar6 = (HTS_LabelString *)0x0;
  dStack_460 = local_468;
  for (sVar5 = 0; num_lines != sVar5; sVar5 = sVar5 + 1) {
    ppuVar2 = __ctype_b_loc();
    if (-1 < (short)(*ppuVar2)[*lines[sVar5]]) break;
    label->size = label->size + 1;
    pHVar3 = (HTS_LabelString *)HTS_calloc(1,0x20);
    if (pHVar6 == (HTS_LabelString *)0x0) {
      pHVar6 = (HTS_LabelString *)label;
    }
    pHVar6->next = pHVar3;
    data_index = 0;
    HVar1 = isdigit_string(lines[sVar5]);
    if (HVar1 == '\0') {
      pHVar3->start = -1.0;
      pHVar3->end = -1.0;
      pcVar4 = HTS_strdup(lines[sVar5]);
    }
    else {
      HTS_get_token_from_string(lines[sVar5],&data_index,buff);
      local_448 = atof(buff);
      HTS_get_token_from_string(lines[sVar5],&data_index,buff);
      local_458 = atof(buff);
      HTS_get_token_from_string(lines[sVar5],&data_index,buff);
      pcVar4 = HTS_strdup(buff);
      pHVar3->start = local_448 * local_468;
      pHVar3->end = local_458 * dStack_460;
    }
    pHVar3->name = pcVar4;
    pHVar3->next = (_HTS_LabelString *)0x0;
    pHVar6 = pHVar3;
  }
  HTS_Label_check_time(label);
  return;
}

Assistant:

void HTS_Label_load_from_strings(HTS_Label * label, size_t sampling_rate, size_t fperiod, char **lines, size_t num_lines)
{
   char buff[HTS_MAXBUFLEN];
   HTS_LabelString *lstring = NULL;
   size_t i;
   size_t data_index;
   double start, end;
   const double rate = (double) sampling_rate / ((double) fperiod * 1e+7);

   if (label->head || label->size != 0) {
      HTS_error(1, "HTS_Label_load_from_fp: label list is not initialized.\n");
      return;
   }
   /* copy label */
   for (i = 0; i < num_lines; i++) {
      if (!isgraph((int) lines[i][0]))
         break;
      label->size++;

      if (lstring) {
         lstring->next = (HTS_LabelString *) HTS_calloc(1, sizeof(HTS_LabelString));
         lstring = lstring->next;
      } else {                  /* first time */
         lstring = (HTS_LabelString *) HTS_calloc(1, sizeof(HTS_LabelString));
         label->head = lstring;
      }
      data_index = 0;
      if (isdigit_string(lines[i])) {   /* has frame infomation */
         HTS_get_token_from_string(lines[i], &data_index, buff);
         start = atof(buff);
         HTS_get_token_from_string(lines[i], &data_index, buff);
         end = atof(buff);
         HTS_get_token_from_string(lines[i], &data_index, buff);
         lstring->name = HTS_strdup(buff);
         lstring->start = rate * start;
         lstring->end = rate * end;
      } else {
         lstring->start = -1.0;
         lstring->end = -1.0;
         lstring->name = HTS_strdup(lines[i]);
      }
      lstring->next = NULL;
   }
   HTS_Label_check_time(label);
}